

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

bool __thiscall aiMetadata::Get<int>(aiMetadata *this,string *key,int *value)

{
  bool bVar1;
  size_t __n;
  aiString local_41c;
  
  __n = 0x3ff;
  if ((key->_M_string_length & 0xfffffc00) == 0) {
    __n = key->_M_string_length & 0xffffffff;
  }
  local_41c.length = (ai_uint32)__n;
  memcpy(local_41c.data,(key->_M_dataplus)._M_p,__n);
  local_41c.data[__n] = '\0';
  bVar1 = Get<int>(this,&local_41c,value);
  return bVar1;
}

Assistant:

inline
    bool Get( const std::string& key, T& value ) const {
        return Get(aiString(key), value);
    }